

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_raw_to_header(mtar_header_t *h,mtar_raw_header_t *rh)

{
  size_t sVar1;
  undefined8 local_30;
  longlong size;
  uint chksum2;
  uint chksum1;
  mtar_raw_header_t *rh_local;
  mtar_header_t *h_local;
  
  _chksum2 = rh;
  rh_local = (mtar_raw_header_t *)h;
  sVar1 = strlen(rh->name);
  if ((99 < sVar1) || (sVar1 = strlen(_chksum2->linkname), 99 < sVar1)) {
    return -9;
  }
  if (_chksum2->checksum[0] == '\0') {
    return -7;
  }
  size._4_4_ = mtar_checksum(_chksum2);
  __isoc99_sscanf(_chksum2->checksum,"%7o",&size);
  if (size._4_4_ != (uint)size) {
    return -6;
  }
  __isoc99_sscanf(_chksum2->mode,"%7o",rh_local);
  __isoc99_sscanf(_chksum2->owner,"%7o",rh_local->name + 4);
  local_30 = 0;
  __isoc99_sscanf(_chksum2->size,"%11llo",&local_30);
  *(undefined8 *)(rh_local->name + 8) = local_30;
  __isoc99_sscanf(_chksum2->mtime,"%11o",rh_local->name + 0x10);
  *(int *)(rh_local->name + 0x14) = (int)_chksum2->type;
  if (0x1ffffffff < *(ulong *)(rh_local->name + 8)) {
    return -10;
  }
  strcpy(rh_local->name + 0x18,_chksum2->name);
  strcpy(rh_local->size,_chksum2->linkname);
  return 0;
}

Assistant:

static int mtar_raw_to_header(mtar_header_t *h, const mtar_raw_header_t *rh) {
  unsigned chksum1, chksum2;
#ifdef HAVE_LONG_LONG
  long long size;
#else
  long size;
#endif

  if (strlen(rh->name) > MTAR_NAMEMAX || strlen(rh->linkname) > MTAR_NAMEMAX)
    return MTAR_ENAMELONG;

  /* If the checksum starts with a null byte we assume the record is NULL */
  if (*rh->checksum == '\0') {
    return MTAR_ENULLRECORD;
  }

  /* Build and compare checksum */
  chksum1 = mtar_checksum(rh);
  sscanf(rh->checksum, "%7o", &chksum2);
  if (chksum1 != chksum2) {
    return MTAR_EBADCHKSUM;
  }

  /* Load raw header into header */
  sscanf(rh->mode, "%7o", &h->mode);
  sscanf(rh->owner, "%7o", &h->owner);
  size = 0;
#ifdef HAVE_LONG_LONG
  sscanf(rh->size, "%11llo", &size);
  h->size = (size_t)size;
#else
  sscanf(rh->size, "%11lo", &size);
  h->size = (size_t)size;
#endif
  sscanf(rh->mtime, "%11o", &h->mtime);
  h->type = (unsigned)rh->type;

  if (h->size > MTAR_SIZEMAX)
    return MTAR_ETOOLARGE;

  strcpy(h->name, rh->name);
  strcpy(h->linkname, rh->linkname);

  return MTAR_ESUCCESS;
}